

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_sha1.c
# Opt level: O0

void ngx_sha1_update(ngx_sha1_t *ctx,void *data,size_t size)

{
  ulong uVar1;
  ulong __n;
  size_t free;
  size_t used;
  size_t size_local;
  void *data_local;
  ngx_sha1_t *ctx_local;
  
  uVar1 = ctx->bytes & 0x3f;
  ctx->bytes = size + ctx->bytes;
  used = size;
  size_local = (size_t)data;
  if (uVar1 != 0) {
    __n = 0x40 - uVar1;
    if (size < __n) {
      memcpy(ctx->buffer + uVar1,data,size);
      return;
    }
    memcpy(ctx->buffer + uVar1,data,__n);
    size_local = (long)data + __n;
    used = size - __n;
    ngx_sha1_body(ctx,ctx->buffer,0x40);
  }
  if (0x3f < used) {
    size_local = (size_t)ngx_sha1_body(ctx,(u_char *)size_local,used & 0xffffffffffffffc0);
    used = used & 0x3f;
  }
  memcpy(ctx->buffer,(void *)size_local,used);
  return;
}

Assistant:

void
ngx_sha1_update(ngx_sha1_t *ctx, const void *data, size_t size)
{
    size_t  used, free;

    used = (size_t) (ctx->bytes & 0x3f);
    ctx->bytes += size;

    if (used) {
        free = 64 - used;

        if (size < free) {
            ngx_memcpy(&ctx->buffer[used], data, size);
            return;
        }

        ngx_memcpy(&ctx->buffer[used], data, free);
        data = (u_char *) data + free;
        size -= free;
        (void) ngx_sha1_body(ctx, ctx->buffer, 64);
    }

    if (size >= 64) {
        data = ngx_sha1_body(ctx, data, size & ~(size_t) 0x3f);
        size &= 0x3f;
    }

    ngx_memcpy(ctx->buffer, data, size);
}